

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
reverse_lexicographic_order
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          Simplex_handle *sh1,Simplex_handle *sh2)

{
  Vertex_handle VVar1;
  Siblings *pSVar2;
  Vertex_handle VVar3;
  Siblings *pSVar4;
  Simplex_vertex_range rg2;
  Simplex_vertex_range rg1;
  Simplex_vertex_range local_68;
  Simplex_handle local_48;
  Simplex_handle local_40;
  Simplex_vertex_range local_38;
  
  local_40 = (Simplex_handle)sh1->m_ptr;
  simplex_vertex_range(&local_38,this,&local_40);
  local_48 = (Simplex_handle)sh2->m_ptr;
  simplex_vertex_range(&local_68,this,&local_48);
  pSVar2 = local_68.
           super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin.sib_;
  pSVar4 = local_38.
           super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           .m_End.sib_;
  VVar3 = local_38.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.v_;
  VVar1 = local_68.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.v_;
  if (local_38.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.v_ !=
      local_38.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End.v_ ||
      local_38.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.sib_ !=
      local_38.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End.sib_) {
    do {
      pSVar2 = local_68.
               super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.sib_;
      pSVar4 = local_38.
               super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin.sib_;
      VVar3 = local_38.
              super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin.v_;
      VVar1 = local_68.
              super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
              .m_End.v_;
      if (local_68.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.v_ ==
          local_68.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End.v_ &&
          local_68.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.sib_ ==
          local_68.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End.sib_) break;
      if (local_38.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.v_ !=
          local_68.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.v_) {
        return local_38.
               super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin.v_ <
               local_68.
               super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin.v_;
      }
      local_38.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.v_ = (local_38.
                     super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                     .m_Begin.sib_)->parent_;
      local_68.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.v_ = (local_68.
                     super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                     .m_Begin.sib_)->parent_;
      local_38.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.sib_ =
           (local_38.
            super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.sib_)->oncles_;
      local_68.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.sib_ =
           (local_68.
            super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.sib_)->oncles_;
      pSVar2 = local_68.
               super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin.sib_;
      pSVar4 = local_38.
               super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.sib_;
      VVar3 = local_38.
              super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
              .m_End.v_;
      VVar1 = local_68.
              super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin.v_;
    } while (local_38.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.v_ !=
             local_38.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End.v_ ||
             local_38.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.sib_ !=
             local_38.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End.sib_);
  }
  return (VVar3 == local_38.
                   super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                   .m_End.v_ &&
         pSVar4 == local_38.
                   super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                   .m_End.sib_) &&
         (VVar1 != local_68.
                   super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                   .m_End.v_ ||
         pSVar2 != local_68.
                   super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                   .m_End.sib_);
}

Assistant:

bool reverse_lexicographic_order(Simplex_handle sh1, Simplex_handle sh2) const {
    Simplex_vertex_range rg1 = simplex_vertex_range(sh1);
    Simplex_vertex_range rg2 = simplex_vertex_range(sh2);
    Simplex_vertex_iterator it1 = rg1.begin();
    Simplex_vertex_iterator it2 = rg2.begin();
    while (it1 != rg1.end() && it2 != rg2.end()) {
      if (*it1 == *it2) {
        ++it1;
        ++it2;
      } else {
        return *it1 < *it2;
      }
    }
    return ((it1 == rg1.end()) && (it2 != rg2.end()));
  }